

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O1

ParseNodeFor *
InvertLoop(ParseNode *outerLoop,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ParseNode *pPVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ParseNodeFor *pPVar5;
  ParseNodeBlock *pPVar6;
  ParseNodeVar *pPVar7;
  ParseNodeUni *pPVar8;
  undefined7 extraout_var;
  undefined1 local_88 [8];
  SymCheck symCheck;
  
  if ((byteCodeGenerator->scriptContext->optimizationOverrides).sideEffects != SideEffects_None) {
    return (ParseNodeFor *)0x0;
  }
  symCheck.permittedSym._0_4_ = 0;
  symCheck.permittedSym._4_1_ = 1;
  if (outerLoop->nop != knopFor) {
    return (ParseNodeFor *)0x0;
  }
  pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
  pPVar1 = pPVar5->pnodeBody;
  if ((pPVar1 == (ParseNode *)0x0) || (pPVar1->nop != knopBlock)) {
    bVar4 = false;
    pPVar6 = (ParseNodeBlock *)0x0;
  }
  else {
    pPVar6 = ParseNode::AsParseNodeBlock(pPVar1);
    pPVar1 = pPVar6->pnodeStmt;
    bVar4 = true;
    if (((pPVar1 != (ParseNode *)0x0) && (pPVar1->nop == knopFor)) &&
       (pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeFor(outerLoop),
       pPVar6->pnodeLexVars != (ParseNodePtr)0x0)) {
      pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
      pPVar6 = (ParseNodeBlock *)pPVar5->pnodeInit;
      if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopVarDecl) {
        pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
        pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
        if (pPVar6->pnodeLexVars != (ParseNodePtr)0x0) {
          pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
          pPVar7 = ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
          pPVar6 = (ParseNodeBlock *)pPVar7->pnodeInit;
          if (((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopInt) &&
             (pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeFor(outerLoop),
             pPVar6->pnodeScopes != (ParseNodePtr)0x0)) {
            pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
            if (pPVar5->pnodeIncr->nop != knopIncPre) {
              pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
              pPVar6 = (ParseNodeBlock *)pPVar5->pnodeIncr;
              if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop != knopIncPost)
              goto LAB_0083846a;
            }
            pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
            pPVar8 = ParseNode::AsParseNodeUni(pPVar5->pnodeIncr);
            pPVar6 = (ParseNodeBlock *)pPVar8->pnode1;
            if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopName) {
              pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
              pPVar7 = ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
              symCheck._72_8_ = pPVar7->pid;
              pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
              pPVar8 = ParseNode::AsParseNodeUni(pPVar5->pnodeIncr);
              pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeName(pPVar8->pnode1);
              lVar2._0_4_ = (pPVar6->super_ParseNodeStmt).grfnop;
              lVar2._4_4_ = (pPVar6->super_ParseNodeStmt).breakLabel;
              if ((symCheck._72_8_ == lVar2) &&
                 (pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeFor(pPVar1),
                 pPVar6->pnodeScopes != (ParseNodePtr)0x0)) {
                pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                if (pPVar5->pnodeIncr->nop != knopIncPre) {
                  pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                  pPVar6 = (ParseNodeBlock *)pPVar5->pnodeIncr;
                  if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop != knopIncPost)
                  goto LAB_0083846a;
                }
                pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeFor(pPVar1);
                if (pPVar6->pnodeLexVars != (ParseNodePtr)0x0) {
                  pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                  pPVar6 = (ParseNodeBlock *)pPVar5->pnodeInit;
                  if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopVarDecl) {
                    pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                    pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
                    if (pPVar6->pnodeLexVars != (ParseNodePtr)0x0) {
                      pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                      pPVar7 = ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
                      pPVar6 = (ParseNodeBlock *)pPVar7->pnodeInit;
                      if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopInt) {
                        pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                        pPVar8 = ParseNode::AsParseNodeUni(pPVar5->pnodeIncr);
                        pPVar6 = (ParseNodeBlock *)pPVar8->pnode1;
                        if ((pPVar6->super_ParseNodeStmt).super_ParseNode.nop == knopName) {
                          pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                          pPVar7 = ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
                          symCheck._72_8_ = pPVar7->pid;
                          pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                          pPVar8 = ParseNode::AsParseNodeUni(pPVar5->pnodeIncr);
                          pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeName(pPVar8->pnode1);
                          lVar3._0_4_ = (pPVar6->super_ParseNodeStmt).grfnop;
                          lVar3._4_4_ = (pPVar6->super_ParseNodeStmt).breakLabel;
                          if (symCheck._72_8_ == lVar3) {
                            pPVar5 = ParseNode::AsParseNodeFor(outerLoop);
                            pPVar7 = ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
                            symCheck._72_8_ = pPVar7->sym;
                            pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                            pPVar6 = (ParseNodeBlock *)ParseNode::AsParseNodeVar(pPVar5->pnodeInit);
                            if ((symCheck._72_8_ != 0) && (pPVar6->pnodeStmt != (ParseNodePtr)0x0))
                            {
                              pPVar5 = ParseNode::AsParseNodeFor(pPVar1);
                              bVar4 = InvertableBlock(pPVar5->pnodeBody,(Symbol *)symCheck._72_8_,
                                                      pPVar1,outerLoop,byteCodeGenerator,
                                                      (SymCheck *)local_88);
                              pPVar6 = (ParseNodeBlock *)CONCAT71(extraout_var,bVar4);
                              if (bVar4) {
                                pPVar6 = (ParseNodeBlock *)
                                         ConstructInvertedLoop
                                                   (pPVar1,outerLoop,byteCodeGenerator,funcInfo);
                              }
                              bVar4 = !bVar4;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0083846a:
  if (bVar4) {
    return (ParseNodeFor *)0x0;
  }
  return (ParseNodeFor *)pPVar6;
}

Assistant:

Js::ScriptContext* GetScriptContext() { return scriptContext; }